

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIFileOpenDialog::setDirectoryName(CGUIFileOpenDialog *this,path *name)

{
  path *p;
  IFileSystem *pIVar1;
  CGUIFileOpenDialog *this_00;
  undefined1 local_48 [32];
  
  if (&this->FileDirectory != name) {
    ::std::__cxx11::string::_M_assign((string *)&this->FileDirectory);
  }
  p = &this->FileDirectoryFlat;
  if (p != name) {
    ::std::__cxx11::string::_M_assign((string *)p);
  }
  pIVar1 = this->FileSystem;
  local_48._8_8_ = 0;
  local_48[0x10] = '\0';
  local_48._0_8_ = (CGUIFileOpenDialog *)(local_48 + 0x10);
  core::string<char>::operator=((string<char> *)local_48,"/");
  (*pIVar1->_vptr_IFileSystem[0x16])(pIVar1,p,local_48);
  this_00 = (CGUIFileOpenDialog *)local_48._0_8_;
  if ((CGUIFileOpenDialog *)local_48._0_8_ != (CGUIFileOpenDialog *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_,CONCAT71(local_48._17_7_,local_48[0x10]) + 1);
  }
  pathToStringW(this_00,&this->FileDirectoryFlatW,p);
  return;
}

Assistant:

void CGUIFileOpenDialog::setDirectoryName(const irr::io::path &name)
{
	FileDirectory = name;
	FileDirectoryFlat = name;
	FileSystem->flattenFilename(FileDirectoryFlat);
	pathToStringW(FileDirectoryFlatW, FileDirectoryFlat);
}